

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O0

string * __thiscall BamTools::Internal::HostAddress::GetIPString_abi_cxx11_(HostAddress *this)

{
  uint8_t uVar1;
  uint8_t uVar2;
  ostream *poVar3;
  void *this_00;
  int *in_RSI;
  string *in_RDI;
  uint8_t i;
  stringstream ss;
  byte local_1a5;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  if (*in_RSI == 0) {
    poVar3 = (ostream *)std::ostream::operator<<(local_188,(uint)*(byte *)((long)in_RSI + 7));
    poVar3 = std::operator<<(poVar3,'.');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*(byte *)((long)in_RSI + 6));
    poVar3 = std::operator<<(poVar3,'.');
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)*(byte *)((long)in_RSI + 5));
    poVar3 = std::operator<<(poVar3,'.');
    std::ostream::operator<<(poVar3,(uint)*(byte *)(in_RSI + 1));
  }
  else if (*in_RSI == 1) {
    for (local_1a5 = 0; local_1a5 < 8; local_1a5 = local_1a5 + 1) {
      if (local_1a5 != 0) {
        std::operator<<(local_188,':');
      }
      this_00 = (void *)std::ostream::operator<<(local_188,std::hex);
      uVar1 = IPv6Address::operator[]((IPv6Address *)(in_RSI + 2),(ulong)((uint)local_1a5 * 2));
      uVar2 = IPv6Address::operator[]
                        ((IPv6Address *)(in_RSI + 2),(ulong)(local_1a5 + 1 + (uint)local_1a5));
      std::ostream::operator<<(this_00,(uint)CONCAT11(uVar1,uVar2));
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string HostAddress::GetIPString() const
{

    std::stringstream ss;

    // IPv4 format
    if (m_protocol == HostAddress::IPv4Protocol) {
        ss << ((m_ip4Address >> 24) & 0xff) << '.' << ((m_ip4Address >> 16) & 0xff) << '.'
           << ((m_ip4Address >> 8) & 0xff) << '.' << (m_ip4Address & 0xff);

    }

    // IPv6 format
    else if (m_protocol == HostAddress::IPv6Protocol) {
        for (uint8_t i = 0; i < 8; ++i) {
            if (i != 0) ss << ':';
            ss << std::hex
               << ((uint16_t(m_ip6Address[2 * i]) << 8) | (uint16_t(m_ip6Address[2 * i + 1])));
        }
    }

    // return result (empty string if unknown protocol)
    return ss.str();
}